

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsStorage.cpp
# Opt level: O2

void __thiscall
vkt::sparse::SparseShaderIntrinsicsInstanceStorage::recordCommands
          (SparseShaderIntrinsicsInstanceStorage *this,VkCommandBuffer commandBuffer,
          VkImageCreateInfo *imageSparseInfo,VkImage imageSparse,VkImage imageTexels,
          VkImage imageResidency)

{
  TextureFormat *format;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  *this_00;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *this_01;
  Move<vk::Handle<(vk::HandleType)21>_> *this_02;
  undefined8 uVar1;
  deUint32 dVar2;
  DeviceDriver *vk;
  VkDevice pVVar3;
  ProgramCollection<vk::ProgramBinary> *this_03;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  VkImageSubresourceRange subresourceRange_03;
  VkImageSubresourceRange subresourceRange_04;
  VkImageSubresourceRange subresourceRange_05;
  VkImageSubresourceRange subresourceRange_06;
  VkDescriptorSet destSet;
  bool bVar4;
  VkFormat VVar5;
  VkDescriptorType VVar6;
  VkImageViewType VVar7;
  uint uVar8;
  InstanceInterface *instance;
  VkPhysicalDevice physicalDevice;
  ProgramBinary *binary;
  NotSupportedError *this_04;
  TestError *this_05;
  deUint32 dVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  VkSpecializationMapEntry *pVVar13;
  undefined8 *puVar14;
  VkSpecializationInfo *pVVar15;
  pointer_____offset_0x10___ *ppuVar16;
  VkImageMemoryBarrier *pVVar17;
  uint uVar18;
  byte bVar19;
  VkDescriptorSet descriptorSet;
  Location local_488;
  deUint32 local_47c;
  deUint32 local_478;
  UVec3 gridSize;
  UVec3 workGroupSize;
  DescriptorPoolBuilder descriptorPoolBuilder;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_358;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_338;
  VkSpecializationInfo specializationInfo;
  VkDescriptorImageInfo imageResidencyDescInfo;
  VkDescriptorImageInfo imageTexelsDescInfo;
  VkDescriptorImageInfo imageSparseDescInfo;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_288;
  VkSpecializationMapEntry specializationMapEntries [6];
  UVec3 specializationData [2];
  DescriptorSetLayoutBuilder descriptorLayerBuilder;
  VkImageMemoryBarrier imageShaderAccessBarriers [3];
  RefBase<vk::Handle<(vk::HandleType)13>_> local_d0;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_b0;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_90;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_70;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_50;
  
  bVar19 = 0;
  instance = Context::getInstanceInterface
                       ((this->super_SparseShaderIntrinsicsInstanceBase).
                        super_SparseResourcesBaseInstance.super_TestInstance.m_context);
  vk = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
       m_deviceDriver.super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.
       m_data.ptr;
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance
                  .super_TestInstance.m_context);
  bVar4 = checkImageFormatFeatureSupport(instance,physicalDevice,imageSparseInfo->format,2);
  if (bVar4) {
    format = &(this->super_SparseShaderIntrinsicsInstanceBase).m_residencyFormat;
    VVar5 = ::vk::mapTextureFormat(format);
    bVar4 = checkImageFormatFeatureSupport(instance,physicalDevice,VVar5,2);
    if (bVar4) {
      this_00 = &(this->super_SparseShaderIntrinsicsInstanceBase).pipelines;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::resize(this_00,(ulong)imageSparseInfo->mipLevels);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
      ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets,
               (ulong)imageSparseInfo->mipLevels);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews,
               (ulong)imageSparseInfo->mipLevels);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews,
               (ulong)imageSparseInfo->mipLevels);
      this_01 = &(this->super_SparseShaderIntrinsicsInstanceBase).imageResidencyViews;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::resize(this_01,(ulong)imageSparseInfo->mipLevels);
      ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&descriptorLayerBuilder);
      VVar6 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                super_TestInstance._vptr_TestInstance[7])(this);
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding(&descriptorLayerBuilder,VVar6,0x20);
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                (&descriptorLayerBuilder,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                (&descriptorLayerBuilder,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)imageShaderAccessBarriers,
                 &descriptorLayerBuilder,&vk->super_DeviceInterface,
                 (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
      local_338.m_data.deleter.m_device = (VkDevice)imageShaderAccessBarriers[0]._16_8_;
      local_338.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)imageShaderAccessBarriers[0]._24_8_;
      local_338.m_data.object.m_internal = imageShaderAccessBarriers[0]._0_8_;
      local_338.m_data.deleter.m_deviceIface = (DeviceInterface *)imageShaderAccessBarriers[0].pNext
      ;
      imageShaderAccessBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      imageShaderAccessBarriers[0]._4_4_ = 0;
      imageShaderAccessBarriers[0].pNext = (void *)0x0;
      imageShaderAccessBarriers[0].srcAccessMask = 0;
      imageShaderAccessBarriers[0].dstAccessMask = 0;
      imageShaderAccessBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      imageShaderAccessBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)19>_> *)imageShaderAccessBarriers);
      makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)imageShaderAccessBarriers,
                         &vk->super_DeviceInterface,
                         (this->super_SparseShaderIntrinsicsInstanceBase).
                         super_SparseResourcesBaseInstance.m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,
                         (VkDescriptorSetLayout)local_338.m_data.object.m_internal);
      local_358.m_data.deleter.m_device = (VkDevice)imageShaderAccessBarriers[0]._16_8_;
      local_358.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)imageShaderAccessBarriers[0]._24_8_;
      local_358.m_data.object.m_internal = imageShaderAccessBarriers[0]._0_8_;
      local_358.m_data.deleter.m_deviceIface = (DeviceInterface *)imageShaderAccessBarriers[0].pNext
      ;
      imageShaderAccessBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      imageShaderAccessBarriers[0]._4_4_ = 0;
      imageShaderAccessBarriers[0].pNext = (void *)0x0;
      imageShaderAccessBarriers[0].srcAccessMask = 0;
      imageShaderAccessBarriers[0].dstAccessMask = 0;
      imageShaderAccessBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      imageShaderAccessBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)16>_> *)imageShaderAccessBarriers);
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&descriptorPoolBuilder);
      VVar6 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                super_TestInstance._vptr_TestInstance[7])(this);
      ::vk::DescriptorPoolBuilder::addType(&descriptorPoolBuilder,VVar6,imageSparseInfo->mipLevels);
      ::vk::DescriptorPoolBuilder::addType
                (&descriptorPoolBuilder,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,imageSparseInfo->mipLevels)
      ;
      ::vk::DescriptorPoolBuilder::addType
                (&descriptorPoolBuilder,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,imageSparseInfo->mipLevels)
      ;
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)specializationMapEntries,
                 &descriptorPoolBuilder,&vk->super_DeviceInterface,
                 (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                 imageSparseInfo->mipLevels);
      imageShaderAccessBarriers[0].srcAccessMask = specializationMapEntries[1].constantID;
      imageShaderAccessBarriers[0].dstAccessMask = specializationMapEntries[1].offset;
      imageShaderAccessBarriers[0].oldLayout = (undefined4)specializationMapEntries[1].size;
      imageShaderAccessBarriers[0].newLayout = specializationMapEntries[1].size._4_4_;
      imageShaderAccessBarriers[0].sType = specializationMapEntries[0].constantID;
      imageShaderAccessBarriers[0]._4_4_ = specializationMapEntries[0].offset;
      imageShaderAccessBarriers[0].pNext = (void *)specializationMapEntries[0].size;
      specializationMapEntries[0].constantID = 0;
      specializationMapEntries[0].offset = 0;
      specializationMapEntries[0].size = 0;
      specializationMapEntries[1].constantID = 0;
      specializationMapEntries[1].offset = 0;
      specializationMapEntries[1].size = 0;
      this_02 = &(this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
                (&this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
      super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
           (VkDevice)imageShaderAccessBarriers[0]._16_8_;
      (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
      super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)imageShaderAccessBarriers[0]._24_8_;
      (this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
           imageShaderAccessBarriers[0]._0_8_;
      (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
      super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)imageShaderAccessBarriers[0].pNext;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)21>_> *)specializationMapEntries);
      dVar2 = imageSparseInfo->mipLevels;
      dVar9 = imageSparseInfo->arrayLayers;
      subresourceRange.levelCount = dVar2;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.baseArrayLayer = 0;
      subresourceRange.layerCount = dVar9;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)specializationMapEntries,0x1000,0x20,
                 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL,imageSparse,
                 subresourceRange);
      pVVar13 = specializationMapEntries;
      pVVar17 = imageShaderAccessBarriers;
      for (lVar11 = 0x44; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(char *)&pVVar17->sType = (char)pVVar13->constantID;
        pVVar13 = (VkSpecializationMapEntry *)((long)pVVar13 + (ulong)bVar19 * -2 + 1);
        pVVar17 = (VkImageMemoryBarrier *)((long)pVVar17 + (ulong)bVar19 * -2 + 1);
      }
      subresourceRange_00.levelCount = dVar2;
      subresourceRange_00.aspectMask = 1;
      subresourceRange_00.baseMipLevel = 0;
      subresourceRange_00.baseArrayLayer = 0;
      subresourceRange_00.layerCount = dVar9;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)specializationMapEntries,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                 VK_IMAGE_LAYOUT_GENERAL,imageTexels,subresourceRange_00);
      pVVar13 = specializationMapEntries;
      pVVar17 = imageShaderAccessBarriers + 1;
      for (lVar11 = 0x44; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(char *)&pVVar17->sType = (char)pVVar13->constantID;
        pVVar13 = (VkSpecializationMapEntry *)((long)pVVar13 + (ulong)bVar19 * -2 + 1);
        pVVar17 = (VkImageMemoryBarrier *)((long)pVVar17 + (ulong)bVar19 * -2 + 1);
      }
      subresourceRange_01.levelCount = dVar2;
      subresourceRange_01.aspectMask = 1;
      subresourceRange_01.baseMipLevel = 0;
      subresourceRange_01.baseArrayLayer = 0;
      subresourceRange_01.layerCount = dVar9;
      local_47c = dVar2;
      local_478 = dVar9;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)specializationMapEntries,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                 VK_IMAGE_LAYOUT_GENERAL,imageResidency,subresourceRange_01);
      pVVar13 = specializationMapEntries;
      pVVar17 = imageShaderAccessBarriers + 2;
      for (lVar11 = 0x44; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(char *)&pVVar17->sType = (char)pVVar13->constantID;
        pVVar13 = (VkSpecializationMapEntry *)((long)pVVar13 + (ulong)bVar19 * -2 + 1);
        pVVar17 = (VkImageMemoryBarrier *)((long)pVVar17 + (ulong)bVar19 * -2 + 1);
      }
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,commandBuffer,0x1000,0x800,0,0,0,0,0,3,imageShaderAccessBarriers);
      puVar14 = &DAT_009b7570;
      pVVar13 = specializationMapEntries;
      for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
        uVar1 = *puVar14;
        pVVar13->constantID = (int)uVar1;
        pVVar13->offset = (int)((ulong)uVar1 >> 0x20);
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
        pVVar13 = (VkSpecializationMapEntry *)&pVVar13[-(ulong)bVar19].size;
      }
      pVVar3 = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object;
      this_03 = ((this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 super_TestInstance.m_context)->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&specializationInfo,"compute",(allocator<char> *)specializationData);
      binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                         (this_03,(string *)&specializationInfo);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)imageShaderAccessBarriers,
                 &vk->super_DeviceInterface,pVVar3,binary,0);
      local_288.m_data.deleter.m_device = (VkDevice)imageShaderAccessBarriers[0]._16_8_;
      local_288.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)imageShaderAccessBarriers[0]._24_8_;
      local_288.m_data.object.m_internal = imageShaderAccessBarriers[0]._0_8_;
      local_288.m_data.deleter.m_deviceIface = (DeviceInterface *)imageShaderAccessBarriers[0].pNext
      ;
      imageShaderAccessBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      imageShaderAccessBarriers[0]._4_4_ = 0;
      imageShaderAccessBarriers[0].pNext = (void *)0x0;
      imageShaderAccessBarriers[0].srcAccessMask = 0;
      imageShaderAccessBarriers[0].dstAccessMask = 0;
      imageShaderAccessBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      imageShaderAccessBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)14>_> *)imageShaderAccessBarriers);
      std::__cxx11::string::~string((string *)&specializationInfo);
      lVar11 = 0;
      uVar12 = 0;
      while( true ) {
        dVar9 = local_478;
        dVar2 = local_47c;
        if (imageSparseInfo->mipLevels <= uVar12) {
          subresourceRange_05.levelCount = local_47c;
          subresourceRange_05.aspectMask = 1;
          subresourceRange_05.baseMipLevel = 0;
          subresourceRange_05.baseArrayLayer = 0;
          subresourceRange_05.layerCount = local_478;
          makeImageMemoryBarrier
                    ((VkImageMemoryBarrier *)&specializationInfo,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                     VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,imageTexels,subresourceRange_05);
          pVVar15 = &specializationInfo;
          pVVar17 = imageShaderAccessBarriers;
          for (lVar11 = 0x44; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(char *)&pVVar17->sType = (char)pVVar15->mapEntryCount;
            pVVar15 = (VkSpecializationInfo *)((long)pVVar15 + (ulong)bVar19 * -2 + 1);
            pVVar17 = (VkImageMemoryBarrier *)((long)pVVar17 + (ulong)bVar19 * -2 + 1);
          }
          subresourceRange_06.levelCount = dVar2;
          subresourceRange_06.aspectMask = 1;
          subresourceRange_06.baseMipLevel = 0;
          subresourceRange_06.baseArrayLayer = 0;
          subresourceRange_06.layerCount = dVar9;
          makeImageMemoryBarrier
                    ((VkImageMemoryBarrier *)&specializationInfo,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                     VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,imageResidency,subresourceRange_06);
          pVVar15 = &specializationInfo;
          pVVar17 = imageShaderAccessBarriers + 1;
          for (lVar11 = 0x44; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(char *)&pVVar17->sType = (char)pVVar15->mapEntryCount;
            pVVar15 = (VkSpecializationInfo *)((long)pVVar15 + (ulong)bVar19 * -2 + 1);
            pVVar17 = (VkImageMemoryBarrier *)((long)pVVar17 + (ulong)bVar19 * -2 + 1);
          }
          (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                    (vk,commandBuffer,0x800,0x1000,0,0,0,0,0,2,imageShaderAccessBarriers);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_288);
          std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
          ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                         *)&descriptorPoolBuilder);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_358);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_338);
          ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&descriptorLayerBuilder);
          return;
        }
        dVar9 = (deUint32)uVar12;
        getShaderGridSize((sparse *)&gridSize,
                          (this->super_SparseShaderIntrinsicsInstanceBase).m_imageType,
                          &(this->super_SparseShaderIntrinsicsInstanceBase).m_imageSize,dVar9);
        computeWorkGroupSize((sparse *)&workGroupSize,&gridSize);
        tcu::Vector<unsigned_int,_3>::Vector
                  (specializationData,(Vector<unsigned_int,_3> *)&gridSize);
        tcu::Vector<unsigned_int,_3>::Vector
                  (specializationData + 1,(Vector<unsigned_int,_3> *)&workGroupSize);
        specializationInfo.mapEntryCount = 6;
        specializationInfo.pMapEntries = specializationMapEntries;
        specializationInfo.dataSize = 0x18;
        specializationInfo.pData = specializationData;
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&local_50,
                            &vk->super_DeviceInterface,
                            (this->super_SparseShaderIntrinsicsInstanceBase).
                            super_SparseResourcesBaseInstance.m_logicalDevice.
                            super_RefBase<vk::VkDevice_s_*>.m_data.object,
                            (VkPipelineLayout)local_358.m_data.object.m_internal,
                            (VkShaderModule)local_288.m_data.object.m_internal,&specializationInfo);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)18>>
                  ((sparse *)imageShaderAccessBarriers,
                   (Move<vk::Handle<(vk::HandleType)18>_> *)&local_50);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator=
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                   ((long)&((this_00->
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11),
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                   imageShaderAccessBarriers);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                   imageShaderAccessBarriers);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_50);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
                  (vk,commandBuffer,1,
                   **(undefined8 **)
                     ((long)&((this_00->
                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11));
        makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_70,
                          &vk->super_DeviceInterface,
                          (this->super_SparseShaderIntrinsicsInstanceBase).
                          super_SparseResourcesBaseInstance.m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,
                          (VkDescriptorPool)
                          (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
                          super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal,
                          (VkDescriptorSetLayout)local_338.m_data.object.m_internal);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
                  ((sparse *)imageShaderAccessBarriers,
                   (Move<vk::Handle<(vk::HandleType)22>_> *)&local_70);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                   ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11),
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                   imageShaderAccessBarriers);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::release
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                   imageShaderAccessBarriers);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_70);
        descriptorSet.m_internal =
             **(deUint64 **)
               ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
        dVar2 = imageSparseInfo->arrayLayers;
        pVVar3 = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object;
        VVar7 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
        subresourceRange_02.baseMipLevel = dVar9;
        subresourceRange_02.aspectMask = 1;
        subresourceRange_02.levelCount = 1;
        subresourceRange_02.baseArrayLayer = 0;
        subresourceRange_02.layerCount = dVar2;
        makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_90,&vk->super_DeviceInterface,
                      pVVar3,imageSparse,VVar7,imageSparseInfo->format,subresourceRange_02);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
                  ((sparse *)imageShaderAccessBarriers,
                   (Move<vk::Handle<(vk::HandleType)13>_> *)&local_90);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11),
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   imageShaderAccessBarriers);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   imageShaderAccessBarriers);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_90);
        imageSparseDescInfo.imageView.m_internal =
             **(deUint64 **)
               ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
        imageSparseDescInfo.sampler.m_internal = 0;
        imageSparseDescInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
        pVVar3 = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object;
        VVar7 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
        subresourceRange_03.baseMipLevel = dVar9;
        subresourceRange_03.aspectMask = 1;
        subresourceRange_03.levelCount = 1;
        subresourceRange_03.baseArrayLayer = 0;
        subresourceRange_03.layerCount = dVar2;
        makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_b0,&vk->super_DeviceInterface,
                      pVVar3,imageTexels,VVar7,imageSparseInfo->format,subresourceRange_03);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
                  ((sparse *)imageShaderAccessBarriers,
                   (Move<vk::Handle<(vk::HandleType)13>_> *)&local_b0);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11),
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   imageShaderAccessBarriers);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   imageShaderAccessBarriers);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_b0);
        imageTexelsDescInfo.imageView.m_internal =
             **(deUint64 **)
               ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
        imageTexelsDescInfo.sampler.m_internal = 0;
        imageTexelsDescInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
        pVVar3 = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object;
        VVar7 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
        VVar5 = ::vk::mapTextureFormat(format);
        subresourceRange_04.baseMipLevel = dVar9;
        subresourceRange_04.aspectMask = 1;
        subresourceRange_04.levelCount = 1;
        subresourceRange_04.baseArrayLayer = 0;
        subresourceRange_04.layerCount = dVar2;
        makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_d0,&vk->super_DeviceInterface,
                      pVVar3,imageResidency,VVar7,VVar5,subresourceRange_04);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
                  ((sparse *)imageShaderAccessBarriers,
                   (Move<vk::Handle<(vk::HandleType)13>_> *)&local_d0);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   ((long)&((this_01->
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11),
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   imageShaderAccessBarriers);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   imageShaderAccessBarriers);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_d0);
        imageResidencyDescInfo.imageView.m_internal =
             **(deUint64 **)
               ((long)&((this_01->
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
        imageResidencyDescInfo.sampler.m_internal = 0;
        imageResidencyDescInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
        ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                  ((DescriptorSetUpdateBuilder *)imageShaderAccessBarriers);
        destSet = descriptorSet;
        local_488.m_binding = 0;
        local_488.m_arrayElement = 0;
        VVar6 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance
                  .super_TestInstance._vptr_TestInstance[7])();
        ::vk::DescriptorSetUpdateBuilder::writeSingle
                  ((DescriptorSetUpdateBuilder *)imageShaderAccessBarriers,destSet,&local_488,VVar6,
                   &imageSparseDescInfo);
        local_488.m_binding = 1;
        local_488.m_arrayElement = 0;
        ::vk::DescriptorSetUpdateBuilder::writeSingle
                  ((DescriptorSetUpdateBuilder *)imageShaderAccessBarriers,descriptorSet,&local_488,
                   VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&imageTexelsDescInfo);
        local_488.m_binding = 2;
        local_488.m_arrayElement = 0;
        ::vk::DescriptorSetUpdateBuilder::writeSingle
                  ((DescriptorSetUpdateBuilder *)imageShaderAccessBarriers,descriptorSet,&local_488,
                   VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&imageResidencyDescInfo);
        ::vk::DescriptorSetUpdateBuilder::update
                  ((DescriptorSetUpdateBuilder *)imageShaderAccessBarriers,
                   &vk->super_DeviceInterface,
                   (this->super_SparseShaderIntrinsicsInstanceBase).
                   super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
                   .m_data.object);
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x56])
                  (vk,commandBuffer,1,local_358.m_data.object.m_internal,0,1,&descriptorSet,0,0);
        uVar10 = (gridSize.m_data[0] / workGroupSize.m_data[0] + 1) -
                 (uint)(gridSize.m_data[0] % workGroupSize.m_data[0] == 0);
        uVar18 = (gridSize.m_data[1] / workGroupSize.m_data[1] + 1) -
                 (uint)(gridSize.m_data[1] % workGroupSize.m_data[1] == 0);
        uVar8 = (gridSize.m_data[2] / workGroupSize.m_data[2] + 1) -
                (uint)(gridSize.m_data[2] % workGroupSize.m_data[2] == 0);
        if (((0xffff < uVar10) || (0xffff < uVar18)) || (0xffff < uVar8)) break;
        (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5d])
                  (vk,commandBuffer,(ulong)uVar10,(ulong)uVar18,(ulong)uVar8);
        ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
                  ((DescriptorSetUpdateBuilder *)imageShaderAccessBarriers);
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x10;
      }
      this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_04,"Image size exceeds compute invocations limit",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
                 ,0x1ec);
      __cxa_throw(this_04,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    this_05 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_05,"Device does not support VK_FORMAT_R32_UINT format for storage image",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
               ,0x167);
    ppuVar16 = &tcu::TestError::typeinfo;
  }
  else {
    this_05 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_05,"Device does not support image format for storage image"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
               ,0x163);
    ppuVar16 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_05,ppuVar16,tcu::Exception::~Exception);
}

Assistant:

void SparseShaderIntrinsicsInstanceStorage::recordCommands (const VkCommandBuffer		commandBuffer,
															const VkImageCreateInfo&	imageSparseInfo,
															const VkImage				imageSparse,
															const VkImage				imageTexels,
															const VkImage				imageResidency)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const DeviceInterface&		deviceInterface = getDeviceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	// Check if device supports image format for storage image
	if (!checkImageFormatFeatureSupport(instance, physicalDevice, imageSparseInfo.format, VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		TCU_THROW(NotSupportedError, "Device does not support image format for storage image");

	// Make sure device supports VK_FORMAT_R32_UINT format for storage image
	if (!checkImageFormatFeatureSupport(instance, physicalDevice, mapTextureFormat(m_residencyFormat), VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		TCU_THROW(TestError, "Device does not support VK_FORMAT_R32_UINT format for storage image");

	pipelines.resize(imageSparseInfo.mipLevels);
	descriptorSets.resize(imageSparseInfo.mipLevels);
	imageSparseViews.resize(imageSparseInfo.mipLevels);
	imageTexelsViews.resize(imageSparseInfo.mipLevels);
	imageResidencyViews.resize(imageSparseInfo.mipLevels);

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descriptorLayerBuilder;

	descriptorLayerBuilder.addSingleBinding(imageSparseDescType(), VK_SHADER_STAGE_COMPUTE_BIT);
	descriptorLayerBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT);
	descriptorLayerBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(descriptorLayerBuilder.build(deviceInterface, getDevice()));

	// Create pipeline layout
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));

	// Create descriptor pool
	DescriptorPoolBuilder descriptorPoolBuilder;

	descriptorPoolBuilder.addType(imageSparseDescType(), imageSparseInfo.mipLevels);
	descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, imageSparseInfo.mipLevels);
	descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, imageSparseInfo.mipLevels);

	descriptorPool = descriptorPoolBuilder.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, imageSparseInfo.mipLevels);

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers);

	{
		VkImageMemoryBarrier imageShaderAccessBarriers[3];

		imageShaderAccessBarriers[0] = makeImageMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_SHADER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			VK_IMAGE_LAYOUT_GENERAL,
			imageSparse,
			fullImageSubresourceRange
		);

		imageShaderAccessBarriers[1] = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			imageTexels,
			fullImageSubresourceRange
		);

		imageShaderAccessBarriers[2] = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			imageResidency,
			fullImageSubresourceRange
		);

		deviceInterface.cmdPipelineBarrier(commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 3u, imageShaderAccessBarriers);
	}

	const VkSpecializationMapEntry specializationMapEntries[6] =
	{
		{ 1u, 0u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.x
		{ 2u, 1u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.y
		{ 3u, 2u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.z
		{ 4u, 3u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.x
		{ 5u, 4u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.y
		{ 6u, 5u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.z
	};

	Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("compute"), 0u));

	for (deUint32 mipLevelNdx = 0u; mipLevelNdx < imageSparseInfo.mipLevels; ++mipLevelNdx)
	{
		const tcu::UVec3  gridSize				= getShaderGridSize(m_imageType, m_imageSize, mipLevelNdx);
		const tcu::UVec3  workGroupSize			= computeWorkGroupSize(gridSize);
		const tcu::UVec3 specializationData[2]	= { gridSize, workGroupSize };

		const VkSpecializationInfo specializationInfo =
		{
			(deUint32)DE_LENGTH_OF_ARRAY(specializationMapEntries),	// mapEntryCount
			specializationMapEntries,								// pMapEntries
			sizeof(specializationData),								// dataSize
			specializationData,										// pData
		};

		// Create and bind compute pipeline
		pipelines[mipLevelNdx] = makeVkSharedPtr(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule, &specializationInfo));
		const VkPipeline computePipeline = **pipelines[mipLevelNdx];

		deviceInterface.cmdBindPipeline(commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, computePipeline);

		// Create descriptor set
		descriptorSets[mipLevelNdx] = makeVkSharedPtr(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));
		const VkDescriptorSet descriptorSet = **descriptorSets[mipLevelNdx];

		// Bind resources
		const VkImageSubresourceRange mipLevelRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, mipLevelNdx, 1u, 0u, imageSparseInfo.arrayLayers);

		imageSparseViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageSparse, mapImageViewType(m_imageType), imageSparseInfo.format, mipLevelRange));
		const VkDescriptorImageInfo imageSparseDescInfo = makeDescriptorImageInfo(DE_NULL, **imageSparseViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		imageTexelsViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageTexels, mapImageViewType(m_imageType), imageSparseInfo.format, mipLevelRange));
		const VkDescriptorImageInfo imageTexelsDescInfo = makeDescriptorImageInfo(DE_NULL, **imageTexelsViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		imageResidencyViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageResidency, mapImageViewType(m_imageType), mapTextureFormat(m_residencyFormat), mipLevelRange));
		const VkDescriptorImageInfo imageResidencyDescInfo = makeDescriptorImageInfo(DE_NULL, **imageResidencyViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		DescriptorSetUpdateBuilder descriptorUpdateBuilder;
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_SPARSE), imageSparseDescType(), &imageSparseDescInfo);
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_TEXELS), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageTexelsDescInfo);
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_RESIDENCY), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageResidencyDescInfo);

		descriptorUpdateBuilder.update(deviceInterface, getDevice());

		deviceInterface.cmdBindDescriptorSets(commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

		const deUint32		xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32		yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32		zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);
		const tcu::UVec3	maxWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxWorkGroupCount.x() < xWorkGroupCount ||
			maxWorkGroupCount.y() < yWorkGroupCount ||
			maxWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size exceeds compute invocations limit");
		}

		deviceInterface.cmdDispatch(commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		VkImageMemoryBarrier imageOutputTransferSrcBarriers[2];

		imageOutputTransferSrcBarriers[0] = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			imageTexels,
			fullImageSubresourceRange
		);

		imageOutputTransferSrcBarriers[1] = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			imageResidency,
			fullImageSubresourceRange
		);

		deviceInterface.cmdPipelineBarrier(commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 2u, imageOutputTransferSrcBarriers);
	}
}